

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_binary.cpp
# Opt level: O3

string * __thiscall
flatbuffers::anon_unknown_5::BinaryFileName
          (string *__return_storage_ptr__,anon_unknown_5 *this,Parser *parser,string *path,
          string *file_name)

{
  long lVar1;
  long *plVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  long *local_80 [2];
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_80[0] = local_70;
  if (parser == (Parser *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"bin","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,this,this + (long)&parser->super_ParserState);
  }
  std::operator+(&local_40,path,file_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  psVar3 = (string *)&local_40.field_2;
  if ((string *)local_40._M_dataplus._M_p != psVar3) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    psVar3 = extraout_RAX;
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

static std::string BinaryFileName(const Parser &parser, const std::string &path,
                                  const std::string &file_name) {
  auto ext = parser.file_extension_.length() ? parser.file_extension_ : "bin";
  return path + file_name + "." + ext;
}